

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.c
# Opt level: O1

bool_t prf_material_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  pool_t pool_id;
  uint32_t *puVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint8_t *puVar4;
  uint len;
  bool_t bVar5;
  uint uVar6;
  float32_t fVar7;
  
  uVar2 = bf_get_uint16_be(bfile);
  node->opcode = uVar2;
  if (uVar2 == prf_material_info.opcode) {
    uVar2 = bf_get_uint16_be(bfile);
    node->length = uVar2;
    if (4 < uVar2 && node->data == (uint8_t *)0x0) {
      pool_id = state->model->mempool_id;
      if (pool_id == 0) {
        puVar4 = (uint8_t *)malloc((ulong)(uVar2 - 4));
      }
      else {
        puVar4 = (uint8_t *)pool_malloc(pool_id,uVar2 - 4);
      }
      node->data = puVar4;
      if (puVar4 == (uint8_t *)0x0) {
        prf_error(9,"memory allocation problem (returned NULL)");
        uVar6 = 4;
        goto LAB_00107ba2;
      }
    }
    uVar6 = 4;
    if (7 < node->length) {
      puVar1 = (uint32_t *)node->data;
      uVar3 = bf_get_uint32_be(bfile);
      *puVar1 = uVar3;
      uVar6 = 8;
      if (0x13 < node->length) {
        bf_read(bfile,(uint8_t *)(puVar1 + 1),0xc);
        uVar6 = 0x14;
        if (0x17 < node->length) {
          uVar3 = bf_get_uint32_be(bfile);
          puVar1[4] = uVar3;
          uVar6 = 0x18;
          if (0x1b < node->length) {
            fVar7 = bf_get_float32_be(bfile);
            puVar1[5] = (uint32_t)fVar7;
            uVar6 = 0x1c;
            if (0x1f < node->length) {
              fVar7 = bf_get_float32_be(bfile);
              puVar1[6] = (uint32_t)fVar7;
              uVar6 = 0x20;
              if (0x23 < node->length) {
                fVar7 = bf_get_float32_be(bfile);
                puVar1[7] = (uint32_t)fVar7;
                uVar6 = 0x24;
                if (0x27 < node->length) {
                  fVar7 = bf_get_float32_be(bfile);
                  puVar1[8] = (uint32_t)fVar7;
                  uVar6 = 0x28;
                  if (0x2b < node->length) {
                    fVar7 = bf_get_float32_be(bfile);
                    puVar1[9] = (uint32_t)fVar7;
                    uVar6 = 0x2c;
                    if (0x2f < node->length) {
                      fVar7 = bf_get_float32_be(bfile);
                      puVar1[10] = (uint32_t)fVar7;
                      uVar6 = 0x30;
                      if (0x33 < node->length) {
                        fVar7 = bf_get_float32_be(bfile);
                        puVar1[0xb] = (uint32_t)fVar7;
                        uVar6 = 0x34;
                        if (0x37 < node->length) {
                          fVar7 = bf_get_float32_be(bfile);
                          puVar1[0xc] = (uint32_t)fVar7;
                          uVar6 = 0x38;
                          if (0x3b < node->length) {
                            fVar7 = bf_get_float32_be(bfile);
                            puVar1[0xd] = (uint32_t)fVar7;
                            uVar6 = 0x3c;
                            if (0x3f < node->length) {
                              fVar7 = bf_get_float32_be(bfile);
                              puVar1[0xe] = (uint32_t)fVar7;
                              uVar6 = 0x40;
                              if (0x43 < node->length) {
                                fVar7 = bf_get_float32_be(bfile);
                                puVar1[0xf] = (uint32_t)fVar7;
                                uVar6 = 0x44;
                                if (0x47 < node->length) {
                                  fVar7 = bf_get_float32_be(bfile);
                                  puVar1[0x10] = (uint32_t)fVar7;
                                  uVar6 = 0x48;
                                  if (0x4b < node->length) {
                                    fVar7 = bf_get_float32_be(bfile);
                                    puVar1[0x11] = (uint32_t)fVar7;
                                    uVar6 = 0x4c;
                                    if (0x4f < node->length) {
                                      fVar7 = bf_get_float32_be(bfile);
                                      puVar1[0x12] = (uint32_t)fVar7;
                                      uVar6 = 0x50;
                                      if (0x53 < node->length) {
                                        uVar3 = bf_get_uint32_be(bfile);
                                        puVar1[0x13] = uVar3;
                                        uVar6 = 0x54;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    bVar5 = 1;
    len = node->length - uVar6;
    if (uVar6 <= node->length && len != 0) {
      bf_read(bfile,node->data + ((ulong)uVar6 - 4),len);
    }
  }
  else {
    prf_error(9,"tried to use material load method on node of type %d.",(ulong)uVar2);
    uVar6 = 2;
LAB_00107ba2:
    bVar5 = 0;
    bf_rewind(bfile,uVar6);
  }
  return bVar5;
}

Assistant:

static
bool_t
prf_material_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos = 4;

    assert( node != NULL && state != NULL && bfile != NULL );

    node->opcode = bf_get_uint16_be( bfile );
    if ( node->opcode != prf_material_info.opcode ) {
        prf_error( 9, "tried to use material load method on node of type %d.",
            node->opcode );
        bf_rewind( bfile, 2 );
        return FALSE;
    }
    node->length = bf_get_uint16_be( bfile );

    if ( node->data == NULL && node->length > 4 ) {
        assert( state->model != NULL );
        if ( state->model->mempool_id == 0 )
            node->data = (uint8_t *)malloc( node->length - 4 + NODE_DATA_PAD );
        else
            node->data = (uint8_t *)pool_malloc( state->model->mempool_id,
                node->length - 4 + NODE_DATA_PAD );
        if ( node->data == NULL ) {
            prf_error( 9, "memory allocation problem (returned NULL)" );
            bf_rewind( bfile, 4 );
            return FALSE;
        }
    }

    do {
        node_data * data = (node_data *) node->data;
        if ( node->length < (pos + 4) ) break;
        data->material_index = bf_get_uint32_be( bfile ); pos += 4;
        if ( node->length < (pos + 12) ) break;
        bf_read( bfile, (uint8_t *) data->name, 12 ); pos += 12;
        if ( node->length < (pos + 4) ) break;
        data->flags = bf_get_uint32_be( bfile ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        data->ambient_red = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->ambient_green = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->ambient_blue = bf_get_float32_be( bfile ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        data->diffuse_red = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->diffuse_green = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->diffuse_blue = bf_get_float32_be( bfile ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        data->specular_red = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->specular_green = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->specular_blue = bf_get_float32_be( bfile ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        data->emissive_red = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->emissive_green = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->emissive_blue = bf_get_float32_be( bfile ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        data->shininess = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->alpha = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->spare = bf_get_uint32_be( bfile ); pos += 4;
    } while ( FALSE );

    if ( pos < node->length )
        pos += bf_read( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}